

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int ResetRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  uchar reqbuf [2];
  
  reqbuf[0] = 0xa5;
  reqbuf[1] = '@';
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,2);
  if (iVar1 == 0) {
    mSleep((long)pRPLIDAR->motordelay);
  }
  else {
    puts("Error writing data to a RPLIDAR. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int ResetRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->reset()))
	{
		printf("A RPLIDAR is not responding correctly : reset() failed. \n");
		return EXIT_FAILURE;
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,RESET_REQUEST_RPLIDAR};

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	// Host systems should wait for at least 2 milliseconds (ms) before sending another request.
	//uSleep(2000);
	// https://github.com/Slamtec/rplidar_sdk/issues/36.
	//mSleep(20);
	mSleep(pRPLIDAR->motordelay);

	return EXIT_SUCCESS;
}